

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolGraph(NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  pointer ppNVar3;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string err;
  GraphViz graph;
  
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  bVar1 = CollectTargetsFromArgs(this,argc,argv,&nodes,&err);
  if (bVar1) {
    graph.dyndep_loader_.state_ = &this->state_;
    graph.dyndep_loader_.disk_interface_ = &(this->disk_interface_).super_DiskInterface;
    graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header;
    graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header;
    graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         graph.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         graph.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GraphViz::Start(&graph);
    for (ppNVar3 = nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppNVar3 !=
        nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish; ppNVar3 = ppNVar3 + 1) {
      GraphViz::AddTarget(&graph,*ppNVar3);
    }
    GraphViz::Finish(&graph);
    GraphViz::~GraphViz(&graph);
    iVar2 = 0;
  }
  else {
    Error("%s",err._M_dataplus._M_p);
    iVar2 = 1;
  }
  std::__cxx11::string::~string((string *)&err);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  return iVar2;
}

Assistant:

int NinjaMain::ToolGraph(const Options* options, int argc, char* argv[]) {
  vector<Node*> nodes;
  string err;
  if (!CollectTargetsFromArgs(argc, argv, &nodes, &err)) {
    Error("%s", err.c_str());
    return 1;
  }

  GraphViz graph(&state_, &disk_interface_);
  graph.Start();
  for (vector<Node*>::const_iterator n = nodes.begin(); n != nodes.end(); ++n)
    graph.AddTarget(*n);
  graph.Finish();

  return 0;
}